

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSession::Poll(RTPSession *this)

{
  int iVar1;
  
  iVar1 = -0x3e;
  if ((this->created == true) && (iVar1 = -0x40, this->usingpollthread == false)) {
    iVar1 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[10])();
    if (-1 < iVar1) {
      iVar1 = ProcessPolledData(this);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int RTPSession::Poll()
{
	int status;
	
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;
	if (usingpollthread)
		return ERR_RTP_SESSION_USINGPOLLTHREAD;
	if ((status = rtptrans->Poll()) < 0)
		return status;
	return ProcessPolledData();
}